

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_input_delete(mpc_input_t *i)

{
  int *in_RDI;
  
  free(*(void **)(in_RDI + 2));
  if (*in_RDI == 0) {
    free(*(void **)(in_RDI + 0xc));
  }
  if (*in_RDI == 2) {
    free(*(void **)(in_RDI + 0xe));
  }
  free(*(void **)(in_RDI + 0x16));
  free(*(void **)(in_RDI + 0x18));
  free(in_RDI);
  return;
}

Assistant:

static void mpc_input_delete(mpc_input_t *i) {

  free(i->filename);

  if (i->type == MPC_INPUT_STRING) { free(i->string); }
  if (i->type == MPC_INPUT_PIPE) { free(i->buffer); }

  free(i->marks);
  free(i->lasts);
  free(i);
}